

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O0

QSize __thiscall QTabWidget::minimumSizeHint(QTabWidget *this)

{
  bool bVar1;
  QTabWidgetPrivate *pQVar2;
  QPalette *pQVar3;
  QStyle *pQVar4;
  QSize QVar5;
  QSize *in_RDI;
  long in_FS_OFFSET;
  QTabWidget *that;
  QTabWidgetPrivate *d;
  QSize sz;
  QSize t;
  QSize s;
  QSize rc;
  QSize lc;
  QStyleOptionTabWidgetFrame opt;
  undefined8 in_stack_fffffffffffffec8;
  QWidget *this_00;
  QTabWidgetPrivate *in_stack_fffffffffffffed0;
  QWidget *this_01;
  QTabWidget *in_stack_fffffffffffffed8;
  QSize *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  QSize *in_stack_ffffffffffffff00;
  undefined4 local_dc;
  QSize local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 auStack_70 [16];
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QTabWidget *)0x6e7730);
  local_a0 = &DAT_aaaaaaaaaaaaaaaa;
  QSize::QSize((QSize *)in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               (int)in_stack_fffffffffffffec8);
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  QSize::QSize((QSize *)in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               (int)in_stack_fffffffffffffec8);
  if ((pQVar2->leftCornerWidget != (QWidget *)0x0) &&
     (bVar1 = QWidget::isVisible((QWidget *)0x6e7795), bVar1)) {
    local_b0 = (undefined1 *)(**(code **)(*(long *)pQVar2->leftCornerWidget + 0x78))();
    local_a0 = local_b0;
  }
  if ((pQVar2->rightCornerWidget != (QWidget *)0x0) &&
     (bVar1 = QWidget::isVisible((QWidget *)0x6e77e5), bVar1)) {
    local_b8 = (undefined1 *)(**(code **)(*(long *)pQVar2->rightCornerWidget + 0x78))();
    local_a8 = local_b8;
  }
  if ((pQVar2->dirty & 1U) == 0) {
    in_stack_ffffffffffffff00 = in_RDI;
    setUpLayout(in_stack_fffffffffffffed8,SUB81((ulong)in_stack_fffffffffffffed0 >> 0x38,0));
  }
  local_c0 = &DAT_aaaaaaaaaaaaaaaa;
  local_c0 = (undefined1 *)
             (**(code **)(*(long *)&(pQVar2->stack->super_QFrame).super_QWidget + 0x78))();
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  QSize::QSize((QSize *)in_stack_fffffffffffffed0);
  bVar1 = QTabWidgetPrivate::isAutoHidden(in_stack_fffffffffffffed0);
  if (!bVar1) {
    local_d0 = (undefined1 *)(**(code **)(*(long *)&pQVar2->tabs->super_QWidget + 0x78))();
    local_c8 = local_d0;
  }
  local_d8 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  bVar1 = true;
  if (pQVar2->pos != North) {
    bVar1 = pQVar2->pos == South;
  }
  local_d8 = basicSize(SUB81((ulong)pQVar2 >> 0x38,0),in_stack_ffffffffffffff00,in_RDI,
                       (QSize *)CONCAT17(bVar1,in_stack_fffffffffffffef0),in_stack_fffffffffffffee8)
  ;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  auStack_70._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  auStack_70._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionTabWidgetFrame::QStyleOptionTabWidgetFrame((QStyleOptionTabWidgetFrame *)0x6e7974);
  (**(code **)((long)*in_RDI + 0x1b0))(in_RDI,&local_98);
  pQVar3 = QWidget::palette(this_01);
  QPalette::operator=((QPalette *)auStack_70,(QPalette *)pQVar3);
  QFlags<QStyle::StateFlag>::QFlags
            ((QFlags<QStyle::StateFlag> *)this_01,(StateFlag)((ulong)this_00 >> 0x20));
  puStack_90 = (undefined1 *)CONCAT44(puStack_90._4_4_,local_dc);
  pQVar4 = QWidget::style(this_00);
  QVar5 = (QSize)(**(code **)(*(long *)pQVar4 + 0xe8))(pQVar4,0x11,&local_98,&local_d8,in_RDI);
  QStyleOptionTabWidgetFrame::~QStyleOptionTabWidgetFrame((QStyleOptionTabWidgetFrame *)0x6e79f7);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return QVar5;
}

Assistant:

QSize QTabWidget::minimumSizeHint() const
{
    Q_D(const QTabWidget);
    QSize lc(0, 0), rc(0, 0);

    if (d->leftCornerWidget && d->leftCornerWidget->isVisible())
        lc = d->leftCornerWidget->minimumSizeHint();
    if (d->rightCornerWidget && d->rightCornerWidget->isVisible())
        rc = d->rightCornerWidget->minimumSizeHint();
    if (!d->dirty) {
        QTabWidget *that = const_cast<QTabWidget*>(this);
        that->setUpLayout(true);
    }
    QSize s(d->stack->minimumSizeHint());
    QSize t;
    if (!d->isAutoHidden())
        t = d->tabs->minimumSizeHint();

    QSize sz = basicSize(d->pos == North || d->pos == South, lc, rc, s, t);

    QStyleOptionTabWidgetFrame opt;
    initStyleOption(&opt);
    opt.palette = palette();
    opt.state = QStyle::State_None;
    return style()->sizeFromContents(QStyle::CT_TabWidget, &opt, sz, this);
}